

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

optional<bool> RemoveRPathXCOFF(string *file,string *emsg,bool *removed)

{
  bool *removed_local;
  string *emsg_local;
  string *file_local;
  
  if (removed != (bool *)0x0) {
    *removed = false;
  }
  std::optional<bool>::optional((optional<bool> *)((long)&file_local + 6));
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)file_local._6_2_;
}

Assistant:

static cm::optional<bool> RemoveRPathXCOFF(std::string const& file,
                                           std::string* emsg, bool* removed)
{
  if (removed) {
    *removed = false;
  }
#if !defined(CMake_USE_XCOFF_PARSER)
  (void)file;
  (void)emsg;
  return cm::nullopt; // Cannot handle XCOFF files.
#else
  cmXCOFF xcoff(file.c_str(), cmXCOFF::Mode::ReadWrite);
  if (!xcoff) {
    return cm::nullopt; // Not a valid XCOFF file.
  }
  bool rm = xcoff.RemoveLibPath();
  if (!xcoff) {
    if (emsg) {
      *emsg = xcoff.GetErrorMessage();
    }
    return false;
  }

  if (removed) {
    *removed = rm;
  }
  return true;
#endif
}